

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator-
          (LE_EulerAngles *__return_storage_ptr__,LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> KStack_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  DataTypeBase local_88;
  char local_80;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  DataTypeBase local_68;
  char local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_58;
  DataTypeBase local_48;
  char local_40;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_EulerAngles_00225f40;
  (__return_storage_ptr__->m_Psi).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00222c28;
  (__return_storage_ptr__->m_Psi).m_Val = (this->m_Psi).m_Val;
  (__return_storage_ptr__->m_Theta).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00222c28;
  (__return_storage_ptr__->m_Theta).m_Val = (this->m_Theta).m_Val;
  (__return_storage_ptr__->m_Phi).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00222c28;
  (__return_storage_ptr__->m_Phi).m_Val = (this->m_Phi).m_Val;
  local_48._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_40 = (Value->m_Psi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_98,&__return_storage_ptr__->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_Psi);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_48);
  local_68._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_60 = (Value->m_Theta).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_a8,&__return_storage_ptr__->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_58,&__return_storage_ptr__->m_Theta);
  DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_a8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_68);
  local_88._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_80 = (Value->m_Phi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&KStack_b8,&__return_storage_ptr__->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_78,&__return_storage_ptr__->m_Phi);
  DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_b8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_88);
  return __return_storage_ptr__;
}

Assistant:

LE_EulerAngles LE_EulerAngles::operator - ( const LE_EulerAngles & Value ) const
{
    LE_EulerAngles tmp = *this;
    tmp.m_Psi   = tmp.m_Psi - Value.m_Psi;
    tmp.m_Theta = tmp.m_Theta - Value.m_Theta;
    tmp.m_Phi   = tmp.m_Phi - Value.m_Phi;
    return tmp;
}